

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollableWindow.cpp
# Opt level: O1

void __thiscall
cursespp::ScrollableWindow::ScrollableWindow
          (ScrollableWindow *this,shared_ptr<cursespp::IScrollAdapter> *adapter,IWindow *parent)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  Window::Window(&this->super_Window,parent);
  (this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__ScrollableWindow_001a9cb8;
  (this->super_Window).super_IWindow.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__ScrollableWindow_001a9ee8;
  (this->super_Window).super_IWindow.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__ScrollableWindow_001a9f18;
  (this->super_Window).super_IWindow.super_IMessageTarget._vptr_IMessageTarget =
       (_func_int **)&PTR__ScrollableWindow_001a9f40;
  (this->super_IScrollable)._vptr_IScrollable = (_func_int **)&PTR__ScrollableWindow_001a9f68;
  (this->super_IKeyHandler)._vptr_IKeyHandler = (_func_int **)&PTR__ScrollableWindow_001a9fb8;
  (this->adapter).super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (adapter->super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (adapter->super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->adapter).super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  *(undefined8 *)((long)&(this->scrollPosition).totalEntries + 1) = 0;
  *(undefined8 *)((long)&(this->scrollPosition).logicalIndex + 1) = 0;
  (this->scrollPosition).lineCount = 0;
  (this->scrollPosition).totalEntries = 0;
  (this->scrollPosition).firstVisibleEntryIndex = 0;
  (this->scrollPosition).visibleEntryCount = 0;
  return;
}

Assistant:

ScrollableWindow::ScrollableWindow(std::shared_ptr<IScrollAdapter> adapter, IWindow *parent)
: Window(parent)
, adapter(adapter)
, allowArrowKeyPropagation(false) {
}